

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O0

matrix4 * matrix4_make_transformation_rotationq(matrix4 *self,quaternion *qT)

{
  float fVar1;
  quaternion *q;
  matrix4 *m;
  quaternion *qT_local;
  matrix4 *self_local;
  
  matrix4_identity(self);
  fVar1 = (qT->field_0).q[1] * (qT->field_0).q[1] + (qT->field_0).q[2] * (qT->field_0).q[2];
  (self->field_0).m[0] = 1.0 - (fVar1 + fVar1);
  (self->field_0).m[4] =
       ((qT->field_0).q[0] * (qT->field_0).q[1] + -((qT->field_0).q[2] * (qT->field_0).q[3])) * 2.0;
  (self->field_0).m[8] =
       ((qT->field_0).q[0] * (qT->field_0).q[2] + (qT->field_0).q[1] * (qT->field_0).q[3]) * 2.0;
  (self->field_0).m[1] =
       ((qT->field_0).q[0] * (qT->field_0).q[1] + (qT->field_0).q[2] * (qT->field_0).q[3]) * 2.0;
  fVar1 = (qT->field_0).q[0] * (qT->field_0).q[0] + (qT->field_0).q[2] * (qT->field_0).q[2];
  (self->field_0).m[5] = 1.0 - (fVar1 + fVar1);
  (self->field_0).m[9] =
       ((qT->field_0).q[1] * (qT->field_0).q[2] + -((qT->field_0).q[0] * (qT->field_0).q[3])) * 2.0;
  (self->field_0).m[2] =
       ((qT->field_0).q[0] * (qT->field_0).q[2] + -((qT->field_0).q[1] * (qT->field_0).q[3])) * 2.0;
  (self->field_0).m[6] =
       ((qT->field_0).q[1] * (qT->field_0).q[2] + (qT->field_0).q[0] * (qT->field_0).q[3]) * 2.0;
  fVar1 = (qT->field_0).q[0] * (qT->field_0).q[0] + (qT->field_0).q[1] * (qT->field_0).q[1];
  (self->field_0).m[10] = 1.0 - (fVar1 + fVar1);
  return self;
}

Assistant:

HYPAPI struct matrix4 *matrix4_make_transformation_rotationq(struct matrix4 *self, const struct quaternion *qT)
{
	struct matrix4 *m;
	const struct quaternion *q;

	q = qT;
	m = self;

	matrix4_identity(m);

	m->m[0] = 1.0f - 2.0f * (q->y * q->y + q->z * q->z);
	m->m[4] = 2.0f * (q->x * q->y - q->z * q->w);
	m->m[8] = 2.0f * (q->x * q->z + q->y * q->w);
	m->m[1] = 2.0f * (q->x * q->y + q->z * q->w);
	m->m[5] = 1.0f - 2.0f * (q->x * q->x + q->z * q->z);
	m->m[9] = 2.0f * (q->y * q->z - q->x * q->w);
	m->m[2] = 2.0f * (q->x * q->z - q->y * q->w);
	m->m[6] = 2.0f * (q->y * q->z + q->x * q->w);
	m->m[10] = 1.0f - 2.0f * (q->x * q->x + q->y * q->y);

	return self;
}